

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

void crnlib::crn_comp::append_vec(vector<unsigned_char> *a,void *p,uint size)

{
  uint i;
  uchar *__dest;
  uint in_EDX;
  void *in_RSI;
  vector<unsigned_char> *in_RDI;
  uint ofs;
  
  if (in_EDX != 0) {
    i = vector<unsigned_char>::size(in_RDI);
    vector<unsigned_char>::resize
              ((vector<unsigned_char> *)CONCAT44(size,ofs),(uint)((ulong)in_RDI >> 0x20),
               SUB81((ulong)in_RDI >> 0x18,0));
    __dest = vector<unsigned_char>::operator[](in_RDI,i);
    memcpy(__dest,in_RSI,(ulong)in_EDX);
  }
  return;
}

Assistant:

void crn_comp::append_vec(crnlib::vector<uint8>& a, const void* p, uint size) {
  if (size) {
    uint ofs = a.size();
    a.resize(ofs + size);

    memcpy(&a[ofs], p, size);
  }
}